

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * __thiscall kj::PathPtr::append(Path *__return_storage_ptr__,PathPtr *this,PathPtr suffix)

{
  size_t sVar1;
  String *pSVar2;
  char *pcVar3;
  String *pSVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  ArrayBuilder<kj::String> newParts;
  String *pSStack_70;
  String local_58;
  Path *local_38;
  
  sVar5 = suffix.parts.size_;
  local_38 = __return_storage_ptr__;
  pSVar4 = (String *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,(this->parts).size_ + sVar5,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  sVar1 = (this->parts).size_;
  pSStack_70 = pSVar4;
  if (sVar1 != 0) {
    pSVar2 = (this->parts).ptr;
    lVar7 = 0;
    do {
      pcVar3 = *(char **)((long)&(pSVar2->content).size_ + lVar7);
      pcVar8 = pcVar3;
      if (pcVar3 != (char *)0x0) {
        pcVar8 = *(char **)((long)&(pSVar2->content).ptr + lVar7);
      }
      pcVar6 = (char *)0x0;
      if (pcVar3 != (char *)0x0) {
        pcVar6 = pcVar3 + -1;
      }
      heapString(&local_58,pcVar8,(size_t)pcVar6);
      (pSStack_70->content).ptr = local_58.content.ptr;
      (pSStack_70->content).size_ = local_58.content.size_;
      (pSStack_70->content).disposer = local_58.content.disposer;
      pSStack_70 = pSStack_70 + 1;
      lVar7 = lVar7 + 0x18;
    } while (sVar1 * 0x18 != lVar7);
  }
  if (sVar5 != 0) {
    lVar7 = 0;
    do {
      pcVar3 = *(char **)((long)&((suffix.parts.ptr)->content).size_ + lVar7);
      pcVar8 = pcVar3;
      if (pcVar3 != (char *)0x0) {
        pcVar8 = *(char **)((long)&((suffix.parts.ptr)->content).ptr + lVar7);
      }
      pcVar6 = (char *)0x0;
      if (pcVar3 != (char *)0x0) {
        pcVar6 = pcVar3 + -1;
      }
      heapString(&local_58,pcVar8,(size_t)pcVar6);
      (pSStack_70->content).ptr = local_58.content.ptr;
      (pSStack_70->content).size_ = local_58.content.size_;
      (pSStack_70->content).disposer = local_58.content.disposer;
      pSStack_70 = pSStack_70 + 1;
      lVar7 = lVar7 + 0x18;
    } while (sVar5 * 0x18 != lVar7);
  }
  (local_38->parts).ptr = pSVar4;
  (local_38->parts).size_ = ((long)pSStack_70 - (long)pSVar4 >> 3) * -0x5555555555555555;
  (local_38->parts).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return local_38;
}

Assistant:

Path PathPtr::append(PathPtr suffix) const {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(heapString(p));
  for (auto& p: suffix.parts) newParts.add(heapString(p));
  return Path(newParts.finish(), Path::ALREADY_CHECKED);
}